

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  double dVar5;
  short sVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  undefined1 uVar10;
  uint uVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  float fVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow *pIVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  float fVar27;
  
  pIVar8 = GImGui;
  pIVar24 = GImGui->MovingWindow;
  pIVar23 = (ImGuiWindow *)0x0;
  if ((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 0x200) == 0)) {
    pIVar23 = pIVar24;
  }
  IVar4 = (GImGui->Style).TouchExtraPadding;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = IVar4.x;
  auVar26._4_4_ = IVar4.y;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar26 = maxps(auVar26,_DAT_00163e10);
    lVar13 = auVar26._0_8_;
  }
  else {
    lVar13 = ((ulong)(uint)IVar4.y << 0x20) + ((ulong)IVar4 & 0xffffffff);
  }
  lVar14 = (long)(GImGui->Windows).Size;
  if (lVar14 < 1) {
    pIVar9 = (ImGuiWindow *)0x0;
  }
  else {
    uVar15 = lVar14 + 1;
    pIVar9 = (ImGuiWindow *)0x0;
    do {
      pIVar7 = (GImGui->Windows).Data[uVar15 - 2];
      if (((pIVar7->Active == true) && (pIVar7->Hidden == false)) &&
         (uVar11 = pIVar7->Flags, (uVar11 >> 9 & 1) == 0)) {
        fVar27 = IVar4.x;
        if ((uVar11 & 0x1000042) == 0) {
          fVar27 = (float)lVar13;
        }
        fVar2 = (GImGui->IO).MousePos.x;
        if ((pIVar7->OuterRectClipped).Min.x - fVar27 <= fVar2) {
          fVar21 = IVar4.y;
          if ((uVar11 & 0x1000042) == 0) {
            fVar21 = (float)((ulong)lVar13 >> 0x20);
          }
          fVar3 = (GImGui->IO).MousePos.y;
          if (((((pIVar7->OuterRectClipped).Min.y - fVar21 <= fVar3) &&
               (fVar2 < fVar27 + (pIVar7->OuterRectClipped).Max.x)) &&
              (fVar3 < fVar21 + (pIVar7->OuterRectClipped).Max.y)) &&
             (((sVar6 = (pIVar7->HitTestHoleSize).x, sVar6 == 0 ||
               (fVar27 = (float)(int)(pIVar7->HitTestHoleOffset).x + (pIVar7->Pos).x, fVar2 < fVar27
               )) || ((fVar27 + (float)(int)sVar6 <= fVar2 ||
                      ((fVar27 = (float)(int)(pIVar7->HitTestHoleOffset).y + (pIVar7->Pos).y,
                       fVar3 < fVar27 || (fVar27 + (float)(int)(pIVar7->HitTestHoleSize).y <= fVar3)
                       ))))))) {
            if (pIVar23 == (ImGuiWindow *)0x0) {
              pIVar23 = pIVar7;
            }
            pIVar22 = pIVar7;
            if (pIVar9 != (ImGuiWindow *)0x0) {
              pIVar22 = pIVar9;
            }
            if (((pIVar24 == (ImGuiWindow *)0x0) || (pIVar9 != (ImGuiWindow *)0x0)) ||
               (pIVar22 = pIVar7, pIVar7->RootWindow != pIVar24->RootWindow)) {
              pIVar9 = pIVar22;
              if (pIVar23 != (ImGuiWindow *)0x0) {
                GImGui->HoveredWindow = pIVar23;
                goto LAB_001176e0;
              }
              pIVar23 = (ImGuiWindow *)0x0;
            }
            else {
              pIVar9 = (ImGuiWindow *)0x0;
            }
          }
        }
      }
      uVar15 = uVar15 - 1;
    } while (1 < uVar15);
  }
  GImGui->HoveredWindow = pIVar23;
  if (pIVar23 == (ImGuiWindow *)0x0) {
    pIVar23 = (ImGuiWindow *)0x0;
    pIVar24 = (ImGuiWindow *)0x0;
  }
  else {
LAB_001176e0:
    pIVar24 = pIVar23->RootWindow;
  }
  pIVar8->HoveredRootWindow = pIVar24;
  pIVar8->HoveredWindowUnderMovingWindow = pIVar9;
  pIVar9 = GetTopMostPopupModal();
  bVar25 = false;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (bVar25 = false, pIVar24 != (ImGuiWindow *)0x0)) {
    if (pIVar24->RootWindow == pIVar9) {
      bVar25 = false;
    }
    else {
      do {
        bVar25 = pIVar24 != pIVar9;
        if (pIVar24 == pIVar9) break;
        pIVar24 = pIVar24->ParentWindow;
      } while (pIVar24 != (ImGuiWindow *)0x0);
    }
  }
  uVar11 = (pIVar8->IO).ConfigFlags;
  iVar17 = -1;
  lVar13 = 0;
  bVar12 = 0;
  do {
    if ((pIVar8->IO).MouseClicked[lVar13] == true) {
      bVar18 = true;
      if (pIVar23 == (ImGuiWindow *)0x0) {
        bVar18 = 0 < (pIVar8->OpenPopupStack).Size;
      }
      (pIVar8->IO).MouseDownOwned[lVar13] = bVar18;
    }
    bVar18 = (pIVar8->IO).MouseDown[lVar13];
    if ((bVar18 == true) &&
       ((iVar17 == -1 ||
        (dVar5 = (pIVar8->IO).MouseClickedTime[iVar17],
        pdVar1 = (pIVar8->IO).MouseClickedTime + lVar13, *pdVar1 <= dVar5 && dVar5 != *pdVar1)))) {
      iVar17 = (int)lVar13;
    }
    bVar12 = bVar12 & 1 | bVar18;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 5);
  bVar20 = 1;
  bVar16 = 1;
  if (iVar17 != -1) {
    bVar16 = (pIVar8->IO).MouseDownOwned[iVar17];
  }
  bVar19 = (byte)((uVar11 & 0x10) >> 4) | bVar25;
  if (pIVar8->DragDropActive == true) {
    bVar20 = (pIVar8->DragDropSourceFlags & 0x10U) == 0 | bVar19;
  }
  if (bVar16 != 0) {
    bVar20 = bVar19;
  }
  if (bVar20 != 0) {
    pIVar8->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  if (pIVar8->WantCaptureMouseNextFrame == -1) {
    bVar25 = true;
    if ((bVar16 & (pIVar23 != (ImGuiWindow *)0x0 || bVar12 != 0)) == 0) {
      bVar25 = 0 < (pIVar8->OpenPopupStack).Size;
    }
    (pIVar8->IO).WantCaptureMouse = bVar25;
  }
  else {
    (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
    bVar25 = pIVar8->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
  }
  else {
    bVar25 = pIVar8->WantCaptureKeyboardNextFrame != 0;
  }
  uVar11 = uVar11 & 9;
  uVar10 = (char)uVar11;
  if (uVar11 != 1) {
    uVar10 = bVar25;
  }
  if ((pIVar8->IO).NavActive == false) {
    uVar10 = bVar25;
  }
  (pIVar8->IO).WantCaptureKeyboard = (bool)uVar10;
  (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}